

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O1

void __thiscall M_tree::insert_leaf(M_tree *this,string *key,int n)

{
  const_iterator __position;
  uint uVar1;
  pointer pcVar2;
  Node *pNVar3;
  long lVar4;
  int iVar5;
  Node *pNVar6;
  undefined8 *puVar7;
  long *plVar8;
  Node *pNVar9;
  ostream *poVar10;
  long *plVar11;
  Node *this_00;
  ulong uVar12;
  pointer pbVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  Node *item;
  hash_add_key result;
  uint32_t newhash [8];
  hash_add_key hasha;
  ifstream file;
  char byte_file [1048576];
  long in_stack_ffffffffffeffca0;
  long in_stack_ffffffffffeffcc0;
  long *plVar17;
  long *plVar18;
  long lVar19;
  uint32_t in_stack_ffffffffffeffd48;
  uint32_t in_stack_ffffffffffeffd4c;
  uint32_t in_stack_ffffffffffeffd50;
  uint32_t in_stack_ffffffffffeffd54;
  undefined8 in_stack_ffffffffffeffd58;
  undefined8 in_stack_ffffffffffeffd60;
  long in_stack_ffffffffffeffdc0;
  uint32_t in_stack_ffffffffffeffdc8;
  
  if ((n == 1) &&
     (iVar14 = (int)((ulong)((long)(this->file_names_p).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->file_names_p).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5), 0 < iVar14)) {
    uVar15 = 0;
    do {
      iVar5 = std::__cxx11::string::compare((string *)key);
      if (iVar5 < 0) {
        pNVar6 = (Node *)operator_new(0x50);
        (pNVar6->key).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar6->key).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar6->key).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pNVar6->hashn[0] = 0;
        pNVar6->hashn[1] = 0;
        pNVar6->hashn[2] = 0;
        pNVar6->hashn[3] = 0;
        pNVar6->hashn[4] = 0;
        pNVar6->hashn[5] = 0;
        pNVar6->hashn[6] = 0;
        pNVar6->hashn[7] = 0;
        pNVar6->parent = (Node *)0x0;
        pNVar6->left = (Node *)0x0;
        pNVar6->right = (Node *)0x0;
        pNVar6->left = (Node *)0x0;
        pNVar6->right = (Node *)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)pNVar6,key);
        pcVar2 = (this->folder_name1)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xffffffffffeffcb8,pcVar2,
                   pcVar2 + (this->folder_name1)._M_string_length);
        std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffeffc98,"/","");
        if (((ulong)(in_stack_ffffffffffeffca0 + in_stack_ffffffffffeffcc0) < 0x10) ||
           (0xf < (ulong)(in_stack_ffffffffffeffca0 + in_stack_ffffffffffeffcc0))) {
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             (&stack0xffffffffffeffcb8,(ulong)&stack0xffffffffffeffca8);
        }
        else {
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&stack0xffffffffffeffc98,0,(char *)0x0,
                              (ulong)&stack0xffffffffffeffcc8);
        }
        plVar18 = puVar7 + 2;
        if ((long *)*puVar7 == plVar18) {
          lVar16 = *plVar18;
          plVar17 = (long *)&stack0xffffffffffeffce8;
        }
        else {
          lVar16 = *plVar18;
          plVar17 = (long *)*puVar7;
        }
        *puVar7 = plVar18;
        puVar7[1] = 0;
        *(undefined1 *)plVar18 = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   (&stack0xffffffffffeffcd8,(ulong)(key->_M_dataplus)._M_p);
        plVar18 = (long *)&stack0xffffffffffeffd08;
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          lVar19 = *plVar11;
        }
        else {
          lVar19 = *plVar11;
          plVar18 = (long *)*plVar8;
        }
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::ifstream::ifstream(&stack0xffffffffffeffdc0,(char *)plVar18,_S_in|_S_bin);
        if (plVar18 != (long *)&stack0xffffffffffeffd08) {
          operator_delete(plVar18,lVar19 + 1);
        }
        if (plVar17 != (long *)&stack0xffffffffffeffce8) {
          operator_delete(plVar17,lVar16 + 1);
        }
        uVar1 = *(uint *)(&stack0xffffffffffeffde0 + *(long *)(in_stack_ffffffffffeffdc0 + -0x18));
        if ((uVar1 & 5) == 0) {
          memset(&stack0xffffffffffefffc8,0,0x100000);
          std::istream::read(&stack0xffffffffffeffdc0,(long)&stack0xffffffffffefffc8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"inserting the file: ",0x14);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(key->_M_dataplus)._M_p,key->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          sha256(&stack0xffffffffffefffc8,in_stack_ffffffffffeffdc8,pNVar6->hashn);
          std::ifstream::close();
          __position._M_current =
               (this->point_p).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start + uVar15;
          pNVar3 = *__position._M_current;
          std::vector<Node_*,_std::allocator<Node_*>_>::insert
                    (&this->point_p,__position,(value_type *)&stack0xffffffffffeffc90);
          this_00 = pNVar3->parent;
          pNVar9 = this_00->left;
          if ((pNVar9 == pNVar3) && (this_00->right == (Node *)0x0)) {
            this_00->right = pNVar6;
LAB_001055c0:
            pNVar6->parent = this_00;
          }
          else {
            if ((pNVar9 == (Node *)0x0) && (this_00->right == pNVar3)) {
              this_00->left = pNVar6;
              goto LAB_001055c0;
            }
            if (pNVar9 == pNVar3) {
              pNVar9 = (Node *)operator_new(0x50);
              pNVar9->left = (Node *)0x0;
              pNVar9->right = (Node *)0x0;
              pNVar9->hashn[6] = 0;
              pNVar9->hashn[7] = 0;
              pNVar9->parent = (Node *)0x0;
              pNVar9->hashn[2] = 0;
              pNVar9->hashn[3] = 0;
              pNVar9->hashn[4] = 0;
              pNVar9->hashn[5] = 0;
              (pNVar9->key).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pNVar9->hashn[0] = 0;
              pNVar9->hashn[1] = 0;
              (pNVar9->key).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (pNVar9->key).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              pNVar9->left = pNVar6;
              pNVar9->right = pNVar3;
              pNVar6->parent = pNVar9;
              this_00 = pNVar3->parent;
              pNVar3->parent = pNVar9;
              this_00->left = pNVar9;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pNVar9
                         ,(pNVar9->left->key).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                         (pNVar9->left->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              pbVar13 = (pNVar9->right->key).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((pNVar9->right->key).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != pbVar13) {
                lVar16 = 0;
                uVar12 = 0;
                do {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)pNVar9,(value_type *)((long)&(pbVar13->_M_dataplus)._M_p + lVar16))
                  ;
                  uVar12 = uVar12 + 1;
                  pbVar13 = (pNVar9->right->key).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar16 = lVar16 + 0x20;
                } while (uVar12 < (ulong)((long)(pNVar9->right->key).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pbVar13 >> 5));
              }
              sha256(&stack0xffffffffffeffd68,0x40,(uint32_t *)&stack0xffffffffffeffd48);
            }
            else {
              pNVar9 = (Node *)operator_new(0x50);
              pNVar9->left = (Node *)0x0;
              pNVar9->right = (Node *)0x0;
              pNVar9->hashn[6] = 0;
              pNVar9->hashn[7] = 0;
              pNVar9->parent = (Node *)0x0;
              pNVar9->hashn[2] = 0;
              pNVar9->hashn[3] = 0;
              pNVar9->hashn[4] = 0;
              pNVar9->hashn[5] = 0;
              (pNVar9->key).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pNVar9->hashn[0] = 0;
              pNVar9->hashn[1] = 0;
              (pNVar9->key).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (pNVar9->key).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              pNVar9->left = pNVar6;
              pNVar9->right = pNVar3;
              pNVar6->parent = pNVar9;
              this_00 = pNVar3->parent;
              pNVar3->parent = pNVar9;
              this_00->right = pNVar9;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pNVar9
                         ,(pNVar6->key).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                         (pNVar6->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              pbVar13 = (pNVar9->right->key).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((pNVar9->right->key).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != pbVar13) {
                lVar16 = 0;
                uVar12 = 0;
                do {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)pNVar9,(value_type *)((long)&(pbVar13->_M_dataplus)._M_p + lVar16))
                  ;
                  uVar12 = uVar12 + 1;
                  pbVar13 = (pNVar9->right->key).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar16 = lVar16 + 0x20;
                } while (uVar12 < (ulong)((long)(pNVar9->right->key).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pbVar13 >> 5));
              }
              sha256(&stack0xffffffffffeffd68,0x40,(uint32_t *)&stack0xffffffffffeffd48);
            }
            *(undefined8 *)(pNVar9->hashn + 4) = in_stack_ffffffffffeffd58;
            *(undefined8 *)(pNVar9->hashn + 6) = in_stack_ffffffffffeffd60;
            pNVar9->hashn[0] = in_stack_ffffffffffeffd48;
            pNVar9->hashn[1] = in_stack_ffffffffffeffd4c;
            pNVar9->hashn[2] = in_stack_ffffffffffeffd50;
            pNVar9->hashn[3] = in_stack_ffffffffffeffd54;
          }
          for (; this_00 != (Node *)0x0; this_00 = this_00->parent) {
            pNVar6 = this_00->left;
            pNVar3 = this_00->right;
            if (pNVar3 == (Node *)0x0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         this_00,(pNVar6->key).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                         (pNVar6->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              sha256(&stack0xffffffffffeffd68,0x40,(uint32_t *)&stack0xffffffffffeffd48);
            }
            else if (pNVar6 == (Node *)0x0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         this_00,(pNVar3->key).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                         (pNVar3->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              sha256(&stack0xffffffffffeffd68,0x40,(uint32_t *)&stack0xffffffffffeffd48);
            }
            else {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         this_00,(pNVar6->key).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                         (pNVar6->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              pbVar13 = (this_00->right->key).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((this_00->right->key).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != pbVar13) {
                lVar16 = 0;
                uVar12 = 0;
                do {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&this_00->key,
                              (value_type *)((long)&(pbVar13->_M_dataplus)._M_p + lVar16));
                  uVar12 = uVar12 + 1;
                  pbVar13 = (this_00->right->key).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar16 = lVar16 + 0x20;
                } while (uVar12 < (ulong)((long)(this_00->right->key).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pbVar13 >> 5));
              }
              sha256(&stack0xffffffffffeffd68,0x40,(uint32_t *)&stack0xffffffffffeffd48);
            }
            *(undefined8 *)(this_00->hashn + 4) = in_stack_ffffffffffeffd58;
            *(undefined8 *)(this_00->hashn + 6) = in_stack_ffffffffffeffd60;
            this_00->hashn[0] = in_stack_ffffffffffeffd48;
            this_00->hashn[1] = in_stack_ffffffffffeffd4c;
            this_00->hashn[2] = in_stack_ffffffffffeffd50;
            this_00->hashn[3] = in_stack_ffffffffffeffd54;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Failed open the file",0x14);
          pcVar2 = (this->folder_name1)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xffffffffffeffcb8,pcVar2,
                     pcVar2 + (this->folder_name1)._M_string_length);
          std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffeffc98,"/","")
          ;
          if (((ulong)(in_stack_ffffffffffeffca0 + in_stack_ffffffffffeffcc0) < 0x10) ||
             (0xf < (ulong)(in_stack_ffffffffffeffca0 + in_stack_ffffffffffeffcc0))) {
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               (&stack0xffffffffffeffcb8,(ulong)&stack0xffffffffffeffca8);
          }
          else {
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&stack0xffffffffffeffc98,0,(char *)0x0,
                                (ulong)&stack0xffffffffffeffcc8);
          }
          plVar18 = puVar7 + 2;
          if ((long *)*puVar7 == plVar18) {
            lVar16 = *plVar18;
            plVar17 = (long *)&stack0xffffffffffeffce8;
          }
          else {
            lVar16 = *plVar18;
            plVar17 = (long *)*puVar7;
          }
          *puVar7 = plVar18;
          puVar7[1] = 0;
          *(undefined1 *)plVar18 = 0;
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     (&stack0xffffffffffeffcd8,(ulong)(key->_M_dataplus)._M_p);
          plVar18 = (long *)&stack0xffffffffffeffd08;
          plVar11 = plVar8 + 2;
          if ((long *)*plVar8 == plVar11) {
            lVar19 = *plVar11;
          }
          else {
            lVar19 = *plVar11;
            plVar18 = (long *)*plVar8;
          }
          lVar4 = plVar8[1];
          *plVar8 = (long)plVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)plVar18,lVar4);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          if (plVar18 != (long *)&stack0xffffffffffeffd08) {
            operator_delete(plVar18,lVar19 + 1);
          }
          if (plVar17 != (long *)&stack0xffffffffffeffce8) {
            operator_delete(plVar17,lVar16 + 1);
          }
        }
        std::ifstream::~ifstream(&stack0xffffffffffeffdc0);
        if ((uVar1 & 5) == 0) {
          return;
        }
      }
      uVar15 = uVar15 + 1;
    } while ((int)uVar15 < iVar14);
  }
  return;
}

Assistant:

void M_tree::insert_leaf(string key, int n) {
    char byte_file[1024*1024];
    Node * item;
    Node * item2;
    Node * leaff;
    Node * up;
    uint32_t newhash[8];
    hash_add_key hasha;
    switch (n) {
        case 1:
        {
            int n = file_names_p.size();
            for(int i=0;i<n;i++){
                if(key < file_names_p[i]){
                    // finish insert
                    item = new(Node);
                    item->right = NULL;
                    item->left = NULL;
                    item->key.push_back(key);
                    ifstream file((string(folder_name1)+string("/")+key).c_str(), ios::in | ios::binary);
                    if(!file){
                        cout << "Failed open the file" << string(folder_name1)+string("/")+key << endl;
                        continue;
                    }
                    memset(byte_file, 0, sizeof(byte_file));
                    file.read(reinterpret_cast<char *>(&byte_file), sizeof(byte_file));
                    cout << "inserting the file: " << key << endl;                //output the file names
                    sha256((uint8_t*)byte_file,file.gcount(), item->hashn);
                    file.close();
                    leaff = point_p[i];
                    point_p.insert(point_p.begin()+i, item);
                    if(leaff->parent->left == leaff && leaff->parent->right == NULL){
                        leaff->parent->right = item;
                        item->parent = leaff->parent;
                        item = item->parent;
                    }
                    else if(leaff->parent->right == leaff && leaff->parent->left == NULL){
                        leaff->parent->left = item;
                        item->parent = leaff->parent;
                        item = item->parent;
                    }
                    else{
                        if(leaff->parent->left == leaff){
                            item2 = new(Node);
                            item2->left = item;
                            item2->right = leaff;
                            item->parent = item2;
                            item = item2;
                            item2 = leaff->parent;
                            leaff->parent = item;
                            item2->left = item;
                            int j;
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            for (j=0;j<item->right->key.size();j++){
                                item->key.push_back(item->right->key[j]);
                            }
                            hasha = add_hash(item->left->hashn, item->right->hashn);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                            item = item2;
                        }
                        else{
                            item2 = new(Node);
                            item2->left = item;
                            item2->right = leaff;
                            item->parent = item2;
                            item = item2;
                            item2 = leaff->parent;
                            leaff->parent = item;
                            item2->right = item;
                            int j;
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            for (j=0;j<item->right->key.size();j++){
                                item->key.push_back(item->right->key[j]);
                            }
                            hasha = add_hash(item->left->hashn, item->right->hashn);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                            item = item2;
                        }
                    }
                    // start update hash and keys
                    while (item!=NULL){
                        if(item->right == NULL){
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            memcpy(hasha.ahash2, item->left->hashn, 32);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                        }
                        else if(item->left == NULL){
                            item->key.assign(item->right->key.begin(), item->right->key.end());
                            memcpy(hasha.ahash2, item->right->hashn, 32);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                        }
                        else{
                            int j;
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            for (j=0;j<item->right->key.size();j++){
                                item->key.push_back(item->right->key[j]);
                            }
                            hasha = add_hash(item->left->hashn, item->right->hashn);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                        }
                        item = item->parent;
                    }
                    return;
                }
            }
            break;
        }
        default:{
            return;
        }
    }
}